

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerMSL::extract_global_variables_from_functions(CompilerMSL *this)

{
  uint uVar1;
  ID id;
  size_t sVar2;
  Variant *pVVar3;
  size_t sVar4;
  TypedID<(spirv_cross::Types)2> *pTVar5;
  bool bVar6;
  uint32_t uVar7;
  StorageClass SVar8;
  SPIRVariable *pSVar9;
  SPIRFunction *pSVar10;
  long lVar11;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  processed_func_ids;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> added_arg_ids;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  global_var_ids;
  uint32_t local_e4;
  undefined1 local_e0 [16];
  undefined1 local_d0 [24];
  pointer local_b8;
  __node_base_ptr p_Stack_b0;
  SmallVector<unsigned_int,_8UL> *local_a8;
  TypedID<(spirv_cross::Types)0> *local_a0;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_98;
  undefined1 local_68 [40];
  Variant *local_40;
  __node_base_ptr p_Stack_38;
  
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ =
       (__uniq_ptr_impl<spirv_cross::ObjectPoolGroup,_std::default_delete<spirv_cross::ObjectPoolGroup>_>
        )0x1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = (pointer)0x0;
  local_68._32_4_ = 1.0;
  local_40 = (Variant *)0x0;
  p_Stack_38 = (__node_base_ptr)0x0;
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    local_a0 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    local_a8 = &this->vars_needing_early_declaration;
    lVar11 = 0;
    do {
      uVar1 = *(uint *)((long)&local_a0->id + lVar11);
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[uVar1].type == TypeVariable) {
        pSVar9 = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + uVar1);
        SVar8 = pSVar9->storage;
        if (SVar8 == Input) {
          bVar6 = Compiler::has_decoration
                            ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,BuiltIn);
          if (bVar6) {
            uVar7 = Compiler::get_decoration
                              ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,BuiltIn);
            if (uVar7 == 0x17) {
              if (((this->msl_options).manual_helper_invocation_updates != true) ||
                 ((this->msl_options).msl_version < 0x4f4c)) goto LAB_002135f3;
              id.id = (pSVar9->super_IVariant).self.id;
              (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
                        ((string *)local_e0,this,0x17,1);
              Compiler::set_name((Compiler *)this,id,(string *)local_e0);
              if ((CompilerMSL *)local_e0._0_8_ != (CompilerMSL *)local_d0) {
                operator_delete((void *)local_e0._0_8_);
              }
              pSVar10 = Variant::get<spirv_cross::SPIRFunction>
                                  ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.
                                   id);
              uVar7 = (pSVar9->super_IVariant).self.id;
              SmallVector<spirv_cross::TypedID<(spirv_cross::Types)2>,_8UL>::reserve
                        (&pSVar10->local_variables,
                         (pSVar10->local_variables).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size
                         + 1);
              sVar4 = (pSVar10->local_variables).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size;
              (pSVar10->local_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr[sVar4].id = uVar7;
              (pSVar10->local_variables).
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.buffer_size = sVar4 + 1
              ;
              uVar7 = (pSVar9->super_IVariant).self.id;
              SmallVector<unsigned_int,_8UL>::reserve
                        (local_a8,(this->vars_needing_early_declaration).
                                  super_VectorView<unsigned_int>.buffer_size + 1);
              sVar4 = (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.
                      buffer_size;
              (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.ptr[sVar4] =
                   uVar7;
              (this->vars_needing_early_declaration).super_VectorView<unsigned_int>.buffer_size =
                   sVar4 + 1;
              local_d0._8_8_ =
                   ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:1901:41)>
                   ::_M_invoke;
              local_d0._0_8_ =
                   ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Cross/spirv_msl.cpp:1901:41)>
                   ::_M_manager;
              local_e0._0_8_ = this;
              local_e0._8_8_ = pSVar9;
              SmallVector<std::function<void_()>,_0UL>::push_back
                        (&pSVar10->fixup_hooks_in,(function<void_()> *)local_e0);
              if ((code *)local_d0._0_8_ != (code *)0x0) {
                (*(code *)local_d0._0_8_)((string *)local_e0,(string *)local_e0,3);
              }
            }
          }
          SVar8 = pSVar9->storage;
        }
        if ((SVar8 < (StorageBuffer|Input)) && ((0x120fU >> (SVar8 & 0x1f) & 1) != 0)) {
          local_e4 = (pSVar9->super_IVariant).self.id;
          local_e0._0_8_ = local_68;
          ::std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_e0._0_8_,&local_e4);
        }
      }
LAB_002135f3:
      lVar11 = lVar11 + 4;
    } while (sVar2 << 2 != lVar11);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_98);
  pSVar10 = Variant::get<spirv_cross::SPIRFunction>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  sVar2 = (pSVar10->local_variables).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.
          buffer_size;
  if (sVar2 != 0) {
    pTVar5 = (pSVar10->local_variables).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)2>_>.ptr;
    lVar11 = 0;
    do {
      pSVar9 = Variant::get<spirv_cross::SPIRVariable>
                         ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr +
                          *(uint *)((long)&pTVar5->id + lVar11));
      if (pSVar9->storage != Function) {
        local_98._M_impl._0_4_ = *(undefined4 *)((long)&pTVar5->id + lVar11);
        local_e0._0_8_ = (CompilerMSL *)local_68;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)local_68,&local_98,local_e0);
      }
      lVar11 = lVar11 + 4;
    } while (sVar2 << 2 != lVar11);
  }
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e0._0_8_ = &p_Stack_b0;
  local_e0._8_8_ = 1;
  local_d0._0_8_ = 0;
  local_d0._8_8_ = 0;
  local_d0._16_4_ = 1.0;
  local_b8 = (pointer)0x0;
  p_Stack_b0 = (__node_base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  extract_global_variables_from_function
            (this,(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id,
             (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)&local_98,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_68,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_e0);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_e0);
  ::std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_98);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)local_68);
  return;
}

Assistant:

void CompilerMSL::extract_global_variables_from_functions()
{
	// Uniforms
	unordered_set<uint32_t> global_var_ids;
	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		// Some builtins resolve directly to a function call which does not need any declared variables.
		// Skip these.
		if (var.storage == StorageClassInput && has_decoration(var.self, DecorationBuiltIn))
		{
			auto bi_type = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
			if (bi_type == BuiltInHelperInvocation && !needs_manual_helper_invocation_updates())
				return;
			if (bi_type == BuiltInHelperInvocation && needs_manual_helper_invocation_updates())
			{
				if (msl_options.is_ios() && !msl_options.supports_msl_version(2, 3))
					SPIRV_CROSS_THROW("simd_is_helper_thread() requires version 2.3 on iOS.");
				else if (msl_options.is_macos() && !msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("simd_is_helper_thread() requires version 2.1 on macOS.");
				// Make sure this is declared and initialized.
				// Force this to have the proper name.
				set_name(var.self, builtin_to_glsl(BuiltInHelperInvocation, StorageClassInput));
				auto &entry_func = this->get<SPIRFunction>(ir.default_entry_point);
				entry_func.add_local_variable(var.self);
				vars_needing_early_declaration.push_back(var.self);
				entry_func.fixup_hooks_in.push_back([this, &var]()
				                                    { statement(to_name(var.self), " = simd_is_helper_thread();"); });
			}
		}

		if (var.storage == StorageClassInput || var.storage == StorageClassOutput ||
		    var.storage == StorageClassUniform || var.storage == StorageClassUniformConstant ||
		    var.storage == StorageClassPushConstant || var.storage == StorageClassStorageBuffer)
		{
			global_var_ids.insert(var.self);
		}
	});

	// Local vars that are declared in the main function and accessed directly by a function
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	for (auto &var : entry_func.local_variables)
		if (get<SPIRVariable>(var).storage != StorageClassFunction)
			global_var_ids.insert(var);

	std::set<uint32_t> added_arg_ids;
	unordered_set<uint32_t> processed_func_ids;
	extract_global_variables_from_function(ir.default_entry_point, added_arg_ids, global_var_ids, processed_func_ids);
}